

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

void llvm::yaml::ScalarTraits<llvm::yaml::Hex64,_void>::output
               (Hex64 *Val,void *param_2,raw_ostream *Out)

{
  uint64_t this;
  uint64_t *puVar1;
  format_object<unsigned_long> local_40;
  uint64_t local_28;
  uint64_t Num;
  raw_ostream *Out_local;
  void *param_1_local;
  Hex64 *Val_local;
  
  Num = (uint64_t)Out;
  Out_local = (raw_ostream *)param_2;
  param_1_local = Val;
  puVar1 = Hex64::operator_cast_to_unsigned_long_(Val);
  this = Num;
  local_28 = *puVar1;
  format<unsigned_long>(&local_40,"0x%016llX",&local_28);
  raw_ostream::operator<<((raw_ostream *)this,&local_40.super_format_object_base);
  return;
}

Assistant:

void ScalarTraits<Hex64>::output(const Hex64 &Val, void *, raw_ostream &Out) {
  uint64_t Num = Val;
  Out << format("0x%016llX", Num);
}